

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O1

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,Register8Bits dest,Registers srcMemReg,int offset)

{
  pointer *ppuVar1;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  uchar *puVar2;
  iterator iVar3;
  Registers RVar4;
  size_t i;
  long lVar5;
  IntToBytes converter;
  undefined8 local_28;
  
  puVar2 = (uchar *)&local_28;
  local_28._4_4_ = (undefined4)((uint7)in_register_00000001 >> 0x18);
  local_28._0_4_ = CONCAT13(0x8a,(int3)CONCAT71(in_register_00000001,in_AL));
  iVar3._M_current =
       (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar3,(uchar *)((long)&local_28 + 3));
  }
  else {
    *iVar3._M_current = 0x8a;
    ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  RVar4 = dest << 3;
  if (srcMemReg == SP) {
    local_28 = CONCAT62(local_28._2_6_,CONCAT11(RVar4,(uchar)local_28)) | 0x8400;
    iVar3._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar3,(uchar *)((long)&local_28 + 1));
    }
    else {
      *iVar3._M_current = RVar4 | 0x84;
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    local_28 = CONCAT71(local_28._1_7_,0x24);
    iVar3._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_00146e25:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar3,puVar2);
      goto LAB_00146e2d;
    }
    *iVar3._M_current = '$';
  }
  else {
    local_28 = CONCAT53(local_28._3_5_,CONCAT12(RVar4 | srcMemReg,(undefined2)local_28)) | 0x800000;
    iVar3._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      puVar2 = (uchar *)((long)&local_28 + 2);
      goto LAB_00146e25;
    }
    *iVar3._M_current = RVar4 | srcMemReg | 0x80;
  }
  ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
LAB_00146e2d:
  local_28 = CONCAT44(offset,(undefined4)local_28);
  lVar5 = 0;
  do {
    puVar2 = (uchar *)((long)&local_28 + lVar5 + 4);
    iVar3._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)codeGen,iVar3,puVar2);
    }
    else {
      *iVar3._M_current = *puVar2;
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, Register8Bits dest, Registers srcMemReg, int offset) {
		codeGen.push_back(0x8a);

		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}